

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::RelativeTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  char cVar1;
  CppType CVar2;
  FileDescriptor *this_00;
  string *psVar3;
  Descriptor *pDVar4;
  EnumDescriptor *this_01;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  string *local_c8;
  int local_90;
  int i;
  int prefix;
  string type;
  undefined1 local_58 [8];
  string containing_type;
  string package;
  FieldDescriptor *field_local;
  
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  bVar7 = true;
  if (CVar2 != CPPTYPE_ENUM) {
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
    bVar7 = CVar2 == CPPTYPE_MESSAGE;
  }
  if (!bVar7) {
    __assert_fail("field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM || field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                  ,0x4bf,
                  "std::string google::protobuf::compiler::js::(anonymous namespace)::RelativeTypeName(const FieldDescriptor *)"
                 );
  }
  this_00 = FieldDescriptor::file((FieldDescriptor *)this);
  psVar3 = FileDescriptor::package_abi_cxx11_(this_00);
  std::__cxx11::string::string
            ((string *)(containing_type.field_2._M_local_buf + 8),(string *)psVar3);
  pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)this);
  psVar3 = Descriptor::full_name_abi_cxx11_(pDVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 psVar3,".");
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if (CVar2 == CPPTYPE_ENUM) {
    this_01 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    local_c8 = EnumDescriptor::full_name_abi_cxx11_(this_01);
  }
  else {
    pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)this);
    local_c8 = Descriptor::full_name_abi_cxx11_(pDVar4);
  }
  std::__cxx11::string::string((string *)&i,(string *)local_c8);
  local_90 = 0;
  while( true ) {
    uVar5 = std::__cxx11::string::size();
    bVar7 = false;
    if ((ulong)(long)local_90 < uVar5) {
      uVar5 = std::__cxx11::string::size();
      bVar7 = (ulong)(long)local_90 < uVar5;
    }
    if (!bVar7) break;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&i);
    cVar1 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
    if (cVar1 != *pcVar6) break;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&i);
    if (*pcVar6 == '.') {
      std::__cxx11::string::size();
    }
    local_90 = local_90 + 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&i);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(containing_type.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string RelativeTypeName(const FieldDescriptor* field) {
  assert(field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM ||
         field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  // For a field with an enum or message type, compute a name relative to the
  // path name of the message type containing this field.
  std::string package = field->file()->package();
  std::string containing_type = field->containing_type()->full_name() + ".";
  std::string type = (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM)
                         ? field->enum_type()->full_name()
                         : field->message_type()->full_name();

  // |prefix| is advanced as we find separators '.' past the common package
  // prefix that yield common prefixes in the containing type's name and this
  // type's name.
  int prefix = 0;
  for (int i = 0; i < type.size() && i < containing_type.size(); i++) {
    if (type[i] != containing_type[i]) {
      break;
    }
    if (type[i] == '.' && i >= package.size()) {
      prefix = i + 1;
    }
  }

  return type.substr(prefix);
}